

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# samplers.cpp
# Opt level: O2

StratifiedSampler *
pbrt::StratifiedSampler::Create(ParameterDictionary *parameters,FileLoc *loc,Allocator alloc)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int *piVar4;
  StratifiedSampler *pSVar5;
  double dVar6;
  undefined8 extraout_XMM0_Qb;
  undefined8 uVar8;
  undefined1 auVar7 [16];
  bool jitter;
  int ySamples;
  int xSamples;
  int seed;
  allocator<char> local_59;
  int va;
  Allocator alloc_local;
  
  alloc_local = alloc;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"jitter",(allocator<char> *)&xSamples);
  bVar1 = ParameterDictionary::GetOneBool(parameters,(string *)&va,true);
  std::__cxx11::string::~string((string *)&va);
  jitter = bVar1;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"xsamples",(allocator<char> *)&ySamples);
  iVar2 = ParameterDictionary::GetOneInt(parameters,(string *)&va,4);
  std::__cxx11::string::~string((string *)&va);
  xSamples = iVar2;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&va,"ysamples",(allocator<char> *)&seed);
  iVar2 = ParameterDictionary::GetOneInt(parameters,(string *)&va,4);
  std::__cxx11::string::~string((string *)&va);
  ySamples = iVar2;
  if ((char)Options[8] == '\x01') {
    uVar8 = extraout_XMM0_Qb;
    piVar4 = pstd::optional<int>::value((optional<int> *)(Options + 7));
    va = *piVar4;
    auVar7._0_8_ = (double)va;
    auVar7._8_8_ = uVar8;
    if (auVar7._0_8_ < 0.0) {
      dVar6 = sqrt(auVar7._0_8_);
    }
    else {
      auVar7 = vsqrtsd_avx(auVar7,auVar7);
      dVar6 = auVar7._0_8_;
    }
    for (iVar2 = (int)dVar6; iVar3 = va / iVar2, va % iVar2 != 0; iVar2 = iVar2 + -1) {
      seed = 0;
      if (iVar2 < 1) {
        va = iVar2;
        LogFatal<char_const(&)[4],char_const(&)[2],char_const(&)[4],int&,char_const(&)[2],int&>
                  (Fatal,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
                   ,0x168,"Check failed: %s > %s with %s = %s, %s = %s",(char (*) [4])0x53cd58,
                   (char (*) [2])0x53f2eb,(char (*) [4])0x53cd58,&va,(char (*) [2])0x53f2eb,&seed);
      }
    }
    ySamples = va / iVar3;
    seed = ySamples * iVar3;
    xSamples = iVar3;
    if (va != seed) {
      LogFatal<char_const(&)[9],char_const(&)[20],char_const(&)[9],int&,char_const(&)[20],int&>
                (Fatal,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
                 ,0x16d,"Check failed: %s == %s with %s = %s, %s = %s",(char (*) [9])0x523852,
                 (char (*) [20])"xSamples * ySamples",(char (*) [9])0x523852,&va,
                 (char (*) [20])"xSamples * ySamples",&seed);
    }
    if (LOGGING_LogLevel < 1) {
      Log<int&,int&>(Verbose,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/samplers.cpp"
                     ,0x16e,"xSamples %d ySamples %d",&xSamples,&ySamples);
    }
  }
  if ((char)Options[0xb] == '\x01') {
    ySamples = 1;
    xSamples = 1;
  }
  std::__cxx11::string::string<std::allocator<char>>((string *)&va,"seed",&local_59);
  iVar2 = ParameterDictionary::GetOneInt(parameters,(string *)&va,*Options);
  std::__cxx11::string::~string((string *)&va);
  seed = iVar2;
  pSVar5 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::StratifiedSampler,int&,int&,bool&,int&>
                     (&alloc_local,&xSamples,&ySamples,&jitter,&seed);
  return pSVar5;
}

Assistant:

StratifiedSampler *StratifiedSampler::Create(const ParameterDictionary &parameters,
                                             const FileLoc *loc, Allocator alloc) {
    bool jitter = parameters.GetOneBool("jitter", true);
    int xSamples = parameters.GetOneInt("xsamples", 4);
    int ySamples = parameters.GetOneInt("ysamples", 4);
    if (Options->pixelSamples) {
        int nSamples = *Options->pixelSamples;
        int div = std::sqrt(nSamples);
        while (nSamples % div) {
            CHECK_GT(div, 0);
            --div;
        }
        xSamples = nSamples / div;
        ySamples = nSamples / xSamples;
        CHECK_EQ(nSamples, xSamples * ySamples);
        LOG_VERBOSE("xSamples %d ySamples %d", xSamples, ySamples);
    }
    if (Options->quickRender)
        xSamples = ySamples = 1;
    int seed = parameters.GetOneInt("seed", Options->seed);

    return alloc.new_object<StratifiedSampler>(xSamples, ySamples, jitter, seed);
}